

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderRenderingTrianglesCase::GeometryShaderRenderingTrianglesCase
          (GeometryShaderRenderingTrianglesCase *this,Context *context,ExtParameters *extParams,
          char *name,bool use_adjacency_data,GLenum drawcall_mode,_shader_output_type output_type)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  TestError *pTVar5;
  float *pfVar6;
  uchar *puVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uchar **ppuVar11;
  undefined7 in_register_00000081;
  _func_int **pp_Var12;
  float **ppfVar13;
  float **ppfVar14;
  ulong uVar15;
  uchar uVar16;
  float fVar17;
  float fVar18;
  ulong uStack_180;
  float local_164;
  float local_160;
  uint whole_rt_height;
  uint single_rt_height;
  uint rendertarget_width;
  uint rendertarget_height;
  ulong local_148;
  uint *local_140;
  float local_134;
  uint whole_rt_width;
  uint single_rt_width;
  Vector<float,_4> local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  uint *local_c0;
  uint *local_b8;
  ulong local_b0;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data_coordinates;
  
  GeometryShaderRenderingCase::GeometryShaderRenderingCase
            (&this->super_GeometryShaderRenderingCase,context,extParams,name,
             "Verifies all draw calls work correctly for specific input+output+draw call mode combination"
            );
  (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderingTrianglesCase_01df93e0;
  *(_shader_output_type *)&(this->super_GeometryShaderRenderingCase).field_0x304 = output_type;
  this->m_drawcall_mode = drawcall_mode;
  this->m_use_adjacency_data = use_adjacency_data;
  this->m_raw_array_instanced_data = (float *)0x0;
  this->m_raw_array_instanced_data_size = 0;
  this->m_raw_array_noninstanced_data = (float *)0x0;
  this->m_raw_array_noninstanced_data_size = 0;
  this->m_unordered_array_instanced_data = (float *)0x0;
  this->m_unordered_array_instanced_data_size = 0;
  this->m_unordered_array_noninstanced_data = (float *)0x0;
  this->m_unordered_array_noninstanced_data_size = 0;
  this->m_unordered_elements_instanced_data = (uchar *)0x0;
  this->m_unordered_elements_instanced_data_size = 0;
  this->m_unordered_elements_noninstanced_data = (uchar *)0x0;
  this->m_unordered_elements_noninstanced_data_size = 0;
  this->m_unordered_elements_max_index = '\x18';
  this->m_unordered_elements_min_index = '\0';
  if ((int)CONCAT71(in_register_00000081,use_adjacency_data) == 0) {
    if (drawcall_mode - 7 < 0xfffffffd) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,
                 "Only GL_TRIANGLES or GL_TRIANGLE_STRIP or GL_TRIANGLE_FAN draw call modes are supported for \'triangles\' geometry shader input layout qualifier test implementation"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0xeeb);
      goto LAB_00cf824b;
    }
  }
  else if (drawcall_mode - 0xe < 0xfffffffe) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,
               "Only GL_TRIANGLES_ADJACENCY_EXT or GL_TRIANGLE_STRIP_ADJACENCY_EXT draw call modes are supported for \'triangles_adjacency\' geometry shader input layout qualifier test implementation"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0xef3);
    goto LAB_00cf824b;
  }
  if (output_type < SHADER_OUTPUT_TYPE_COUNT) {
    local_164 = 0.0;
    if (output_type != SHADER_OUTPUT_TYPE_TRIANGLE_STRIP) {
      local_164 = 1.5;
    }
    uVar8 = 0;
    while ((int)uVar8 != 2) {
      rendertarget_height = 0;
      rendertarget_width = 0;
      pp_Var12 = (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                 super_TestNode._vptr_TestNode;
      if ((int)uVar8 == 0) {
        uVar3 = 1;
        local_c0 = &this->m_unordered_elements_noninstanced_data_size;
        ppuVar11 = &this->m_unordered_elements_noninstanced_data;
        ppfVar13 = &this->m_unordered_array_noninstanced_data;
        ppfVar14 = &this->m_raw_array_noninstanced_data;
        local_140 = &this->m_raw_array_noninstanced_data_size;
        local_b8 = &this->m_unordered_array_noninstanced_data_size;
      }
      else {
        uVar3 = (*pp_Var12[5])(this);
        pp_Var12 = (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                   super_TestNode._vptr_TestNode;
        local_c0 = &this->m_unordered_elements_instanced_data_size;
        ppuVar11 = &this->m_unordered_elements_instanced_data;
        ppfVar13 = &this->m_unordered_array_instanced_data;
        ppfVar14 = &this->m_raw_array_instanced_data;
        local_140 = &this->m_raw_array_instanced_data_size;
        local_b8 = &this->m_unordered_array_instanced_data_size;
      }
      (*pp_Var12[0xd])(this,(ulong)uVar3,&rendertarget_width,&rendertarget_height);
      single_rt_height = 0;
      uVar10 = (ulong)rendertarget_width;
      single_rt_width = 0;
      uVar15 = (ulong)rendertarget_height;
      whole_rt_width = 0;
      local_b0 = uVar8;
      iVar4 = (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                super_TestNode._vptr_TestNode[7])(this);
      *local_140 = iVar4 << 4;
      pfVar6 = (float *)operator_new__((ulong)(uint)(iVar4 << 4));
      *ppfVar14 = pfVar6;
      (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
        _vptr_TestNode[0xd])(this,1,&single_rt_width,&single_rt_height);
      uVar3 = (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                super_TestNode._vptr_TestNode[5])(this);
      (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
        _vptr_TestNode[0xd])(this,(ulong)uVar3,&whole_rt_width);
      data_coordinates.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      data_coordinates.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      data_coordinates.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((int)local_b0 == 0) {
        fVar17 = 0.0;
        local_160 = 1.0;
      }
      else {
        local_160 = (float)single_rt_height / 0.0 + (float)single_rt_height / 0.0 + -1.0;
        fVar17 = (local_160 + 1.0) * 0.5 + -1.0;
      }
      local_128.m_data._0_8_ = (ulong)(uint)fVar17 << 0x20;
      local_128.m_data[2] = 0.0;
      local_128.m_data[3] = 1.0;
      local_148 = uVar15;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
                 &data_coordinates,&local_128);
      local_134 = (2.0 / (float)uVar10) * local_164;
      local_128.m_data[1] = fVar17;
      local_128.m_data[0] = local_134 + -1.0;
      local_128.m_data[2] = 0.0;
      local_128.m_data[3] = 0.0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
                 &data_coordinates,&local_128);
      fVar18 = (2.0 / (float)(long)local_148) * local_164;
      local_148 = CONCAT44(local_148._4_4_,fVar18);
      local_128.m_data._0_8_ = (ulong)(uint)(fVar18 + -1.0) << 0x20;
      local_128.m_data[2] = 0.0;
      local_128.m_data[3] = 0.0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
                 &data_coordinates,&local_128);
      local_128.m_data[0] = 1.0 - local_134;
      local_128.m_data[2] = 0.0;
      local_128.m_data[3] = 0.0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
                 &data_coordinates,&local_128);
      local_128.m_data._0_8_ = (ulong)(uint)(local_160 - (float)local_148) << 0x20;
      local_128.m_data[2] = 0.0;
      local_128.m_data[3] = 0.0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
                 &data_coordinates,&local_128);
      local_d8 = 0;
      uStack_d0 = 0;
      local_e8 = 0;
      uStack_e0 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      local_108 = 0;
      uStack_100 = 0;
      local_118 = 0;
      uStack_110 = 0;
      local_128.m_data[0] = 0.0;
      local_128.m_data[1] = 0.0;
      local_128.m_data[2] = 0.0;
      local_128.m_data[3] = 0.0;
      pfVar6 = *ppfVar14;
      for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 1) {
        local_128.m_data[lVar9] = -NAN;
      }
      switch(this->m_drawcall_mode) {
      case 4:
        local_128.m_data[0] = 0.0;
        local_128.m_data[1] = 1.4013e-45;
        local_128.m_data[2] = 2.8026e-45;
        local_128.m_data[3] = 0.0;
        local_118 = 0x300000002;
        uStack_110 = 0x300000000;
        local_108 = 4;
        uStack_100 = 0x100000004;
        uStack_180 = 0xc;
        break;
      case 5:
        local_128.m_data[0] = 1.4013e-45;
        local_128.m_data[1] = 0.0;
        local_128.m_data[2] = 2.8026e-45;
        local_128.m_data[3] = 4.2039e-45;
        local_118 = 0x400000000;
        uStack_110 = CONCAT44(uStack_110._4_4_,1);
        uStack_180 = 7;
        break;
      case 6:
        local_128.m_data[0] = 0.0;
        local_128.m_data[1] = 1.4013e-45;
        local_128.m_data[2] = 2.8026e-45;
        local_128.m_data[3] = 4.2039e-45;
        local_118 = 0x100000004;
        uStack_180 = 6;
        break;
      default:
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Unsupported draw call mode",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0xff2);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      case 0xc:
        local_128.m_data[0] = 0.0;
        local_128.m_data[1] = 0.0;
        local_128.m_data[2] = 1.4013e-45;
        local_128.m_data[3] = 0.0;
        local_118 = 2;
        uStack_110 = 0;
        local_108 = 2;
        uStack_100 = 3;
        local_f8 = 0;
        uStack_f0 = 3;
        local_e8 = 4;
        uStack_e0 = 0;
        local_d8 = 4;
        uStack_d0 = 1;
        uStack_180 = 0x18;
        break;
      case 0xd:
        local_128.m_data[0] = 1.4013e-45;
        local_128.m_data[1] = 0.0;
        local_128.m_data[2] = 0.0;
        local_128.m_data[3] = 0.0;
        local_118 = 2;
        uStack_110 = 3;
        local_108 = 0;
        uStack_100 = 4;
        local_f8 = 1;
        uStack_180 = 0xe;
      }
      for (uVar8 = 0; uStack_180 != uVar8; uVar8 = uVar8 + 1) {
        lVar9 = (long)(int)local_128.m_data[uVar8];
        if (lVar9 != -1) {
          *pfVar6 = data_coordinates.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar9].m_data[0];
          pfVar6[1] = data_coordinates.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar9].m_data[1];
          pfVar6[2] = data_coordinates.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar9].m_data[2];
          pfVar6[3] = data_coordinates.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar9].m_data[3];
          pfVar6 = pfVar6 + 4;
        }
      }
      uVar3 = *local_140;
      *local_b8 = uVar3;
      pfVar6 = (float *)operator_new__((ulong)uVar3 << 2);
      *ppfVar13 = pfVar6;
      *local_c0 = (uint)uStack_180;
      puVar7 = (uchar *)operator_new__(uStack_180);
      *ppuVar11 = puVar7;
      uVar8 = (ulong)((uint)uStack_180 << 4);
      lVar9 = -0x10;
      for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 0x10) {
        uVar2 = ((undefined8 *)((long)*ppfVar14 + uVar10))[1];
        puVar1 = (undefined8 *)((long)*ppfVar13 + lVar9 + uVar8);
        *puVar1 = *(undefined8 *)((long)*ppfVar14 + uVar10);
        puVar1[1] = uVar2;
        lVar9 = lVar9 + -0x10;
      }
      uVar16 = (uchar)uStack_180;
      for (uVar8 = 0; uVar16 = uVar16 + 0xff, uVar8 != uStack_180; uVar8 = uVar8 + 1) {
        (*ppuVar11)[uVar8] = uVar16;
      }
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&data_coordinates.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      uVar8 = (ulong)((int)local_b0 + 1);
    }
    return;
  }
  pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar5,
             "Unsupported output layout qualifier type requested for \'triangles\' geometry shader input layout qualifier test implementation"
             ,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
             ,0xefb);
LAB_00cf824b:
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

GeometryShaderRenderingTrianglesCase::GeometryShaderRenderingTrianglesCase(Context&				context,
																		   const ExtParameters& extParams,
																		   const char* name, bool use_adjacency_data,
																		   glw::GLenum		   drawcall_mode,
																		   _shader_output_type output_type)
	: GeometryShaderRenderingCase(
		  context, extParams, name,
		  "Verifies all draw calls work correctly for specific input+output+draw call mode combination")
	, m_output_type(output_type)
	, m_drawcall_mode(drawcall_mode)
	, m_use_adjacency_data(use_adjacency_data)
	, m_raw_array_instanced_data(0)
	, m_raw_array_instanced_data_size(0)
	, m_raw_array_noninstanced_data(0)
	, m_raw_array_noninstanced_data_size(0)
	, m_unordered_array_instanced_data(0)
	, m_unordered_array_instanced_data_size(0)
	, m_unordered_array_noninstanced_data(0)
	, m_unordered_array_noninstanced_data_size(0)
	, m_unordered_elements_instanced_data(0)
	, m_unordered_elements_instanced_data_size(0)
	, m_unordered_elements_noninstanced_data(0)
	, m_unordered_elements_noninstanced_data_size(0)
	, m_unordered_elements_max_index(24) /* maximum amount of vertices generated by this test case */
	, m_unordered_elements_min_index(0)
{
	/* Sanity checks */
	if (!m_use_adjacency_data)
	{
		if (drawcall_mode != GL_TRIANGLES && drawcall_mode != GL_TRIANGLE_STRIP && drawcall_mode != GL_TRIANGLE_FAN)
		{
			TCU_FAIL("Only GL_TRIANGLES or GL_TRIANGLE_STRIP or GL_TRIANGLE_FAN draw call modes are supported for "
					 "'triangles' geometry shader input layout qualifier test implementation");
		}
	}
	else
	{
		if (drawcall_mode != GL_TRIANGLES_ADJACENCY_EXT && drawcall_mode != GL_TRIANGLE_STRIP_ADJACENCY_EXT)
		{
			TCU_FAIL("Only GL_TRIANGLES_ADJACENCY_EXT or GL_TRIANGLE_STRIP_ADJACENCY_EXT draw call modes are supported "
					 "for 'triangles_adjacency' geometry shader input layout qualifier test implementation");
		}
	}

	if (output_type != SHADER_OUTPUT_TYPE_POINTS && output_type != SHADER_OUTPUT_TYPE_LINE_STRIP &&
		output_type != SHADER_OUTPUT_TYPE_TRIANGLE_STRIP)
	{
		TCU_FAIL("Unsupported output layout qualifier type requested for 'triangles' geometry shader input layout "
				 "qualifier test implementation");
	}

	/* Generate data in two flavors - one for non-instanced case, the other one for instanced case */
	for (int n_case = 0; n_case < 2 /* cases */; ++n_case)
	{
		bool			is_instanced					 = (n_case != 0);
		int				n_instances						 = 0;
		float**			raw_arrays_data_ptr				 = NULL;
		unsigned int*   raw_arrays_data_size_ptr		 = NULL;
		unsigned int	rendertarget_height				 = 0;
		unsigned int	rendertarget_width				 = 0;
		float**			unordered_arrays_data_ptr		 = NULL;
		unsigned int*   unordered_arrays_data_size_ptr   = NULL;
		unsigned char** unordered_elements_data_ptr		 = NULL;
		unsigned int*   unordered_elements_data_size_ptr = NULL;

		if (!is_instanced)
		{
			/* Non-instanced case */
			n_instances						 = 1;
			raw_arrays_data_ptr				 = &m_raw_array_noninstanced_data;
			raw_arrays_data_size_ptr		 = &m_raw_array_noninstanced_data_size;
			unordered_arrays_data_ptr		 = &m_unordered_array_noninstanced_data;
			unordered_arrays_data_size_ptr   = &m_unordered_array_noninstanced_data_size;
			unordered_elements_data_ptr		 = &m_unordered_elements_noninstanced_data;
			unordered_elements_data_size_ptr = &m_unordered_elements_noninstanced_data_size;
		}
		else
		{
			/* Instanced case */
			n_instances						 = getAmountOfDrawInstances();
			raw_arrays_data_ptr				 = &m_raw_array_instanced_data;
			raw_arrays_data_size_ptr		 = &m_raw_array_instanced_data_size;
			unordered_arrays_data_ptr		 = &m_unordered_array_instanced_data;
			unordered_arrays_data_size_ptr   = &m_unordered_array_instanced_data_size;
			unordered_elements_data_ptr		 = &m_unordered_elements_instanced_data;
			unordered_elements_data_size_ptr = &m_unordered_elements_instanced_data_size;
		}

		getRenderTargetSize(n_instances, &rendertarget_width, &rendertarget_height);

		/* Store full-screen quad coordinates that will be used for actual array data generation. */
		float dx = 2.0f / float(rendertarget_width);
		float dy = 2.0f / float(rendertarget_height);

		/* Generate raw vertex array data */
		unsigned int single_rt_height = 0;
		unsigned int single_rt_width  = 0;
		unsigned int whole_rt_width   = 0;
		unsigned int whole_rt_height  = 0;

		*raw_arrays_data_size_ptr =
			static_cast<unsigned int>(getAmountOfVerticesPerInstance() * 4 /* components */ * sizeof(float));
		*raw_arrays_data_ptr = new float[*raw_arrays_data_size_ptr / sizeof(float)];

		getRenderTargetSize(1, &single_rt_width, &single_rt_height);
		getRenderTargetSize(getAmountOfDrawInstances(), &whole_rt_width, &whole_rt_height);

		/* Generate the general coordinates storage first.
		 *
		 * For non-instanced draw calls, we only need to draw a single instance, hence we are free
		 * to use screen-space coordinates.
		 * For instanced draw calls, we'll have the vertex shader add gl_InstanceID-specific deltas
		 * to make sure the vertices are laid out correctly, so map <-1, 1> range to <0, screen_space_height_of_single_instance>
		 */
		std::vector<tcu::Vec4> data_coordinates;
		float				   dx_multiplier = 0.0f;
		float				   dy_multiplier = 0.0f;
		float				   end_y		 = 0.0f;
		float				   mid_y		 = 0.0f;
		float				   start_y		 = 0.0f;

		if (is_instanced)
		{
			start_y = -1.0f;
			end_y   = start_y + float(single_rt_height) / float(whole_rt_height) * 2.0f;
			mid_y   = start_y + (end_y - start_y) * 0.5f;
		}
		else
		{
			end_y   = 1.0f;
			mid_y   = 0.0f;
			start_y = -1.0f;
		}

		if (output_type == SHADER_OUTPUT_TYPE_POINTS)
		{
			dx_multiplier = 1.5f;
			dy_multiplier = 1.5f;
		}
		else if (output_type == SHADER_OUTPUT_TYPE_LINE_STRIP)
		{
			dx_multiplier = 1.5f;
			dy_multiplier = 1.5f;
		}

		/* W stores information whether given vertex is the middle vertex */
		data_coordinates.push_back(tcu::Vec4(0, mid_y, 0, 1));						  /* Middle vertex */
		data_coordinates.push_back(tcu::Vec4(-1 + dx * dx_multiplier, mid_y, 0, 0));  /* Left vertex */
		data_coordinates.push_back(tcu::Vec4(0, start_y + dy * dy_multiplier, 0, 0)); /* Top vertex */
		data_coordinates.push_back(tcu::Vec4(1 - dx * dx_multiplier, mid_y, 0, 0));   /* Right vertex */
		data_coordinates.push_back(tcu::Vec4(0, end_y - dy * dy_multiplier, 0, 0));   /* Bottom vertex */

		/* Now that we have the general storage ready, we can generate raw array data for specific draw
		 * call that this specific test instance will be verifying */
		int	n_raw_array_indices	 = 0;
		int	raw_array_indices[24]   = { -1 }; /* 12 is a max for all supported input geometry */
		float* raw_array_traveller_ptr = *raw_arrays_data_ptr;

		for (unsigned int n = 0; n < sizeof(raw_array_indices) / sizeof(raw_array_indices[0]); ++n)
		{
			raw_array_indices[n] = -1;
		}

		switch (m_drawcall_mode)
		{
		case GL_TRIANGLES:
		{
			/* ABC triangle */
			raw_array_indices[0] = 0;
			raw_array_indices[1] = 1;
			raw_array_indices[2] = 2;

			/* ACD triangle */
			raw_array_indices[3] = 0;
			raw_array_indices[4] = 2;
			raw_array_indices[5] = 3;

			/* ADE triangle */
			raw_array_indices[6] = 0;
			raw_array_indices[7] = 3;
			raw_array_indices[8] = 4;

			/* AEB triangle */
			raw_array_indices[9]  = 0;
			raw_array_indices[10] = 4;
			raw_array_indices[11] = 1;

			n_raw_array_indices = 12;

			break;
		} /* case GL_TRIANGLES: */

		case GL_TRIANGLES_ADJACENCY_EXT:
		{
			/* Note: Geometry shader used by this test does not rely on adjacency data
			 *       so we will fill corresponding indices with meaningless information
			 *       (always first vertex data) */
			/* ABC triangle */
			raw_array_indices[0] = 0;
			raw_array_indices[1] = 0;
			raw_array_indices[2] = 1;
			raw_array_indices[3] = 0;
			raw_array_indices[4] = 2;
			raw_array_indices[5] = 0;

			/* ACD triangle */
			raw_array_indices[6]  = 0;
			raw_array_indices[7]  = 0;
			raw_array_indices[8]  = 2;
			raw_array_indices[9]  = 0;
			raw_array_indices[10] = 3;
			raw_array_indices[11] = 0;

			/* ADE triangle */
			raw_array_indices[12] = 0;
			raw_array_indices[13] = 0;
			raw_array_indices[14] = 3;
			raw_array_indices[15] = 0;
			raw_array_indices[16] = 4;
			raw_array_indices[17] = 0;

			/* AEB triangle */
			raw_array_indices[18] = 0;
			raw_array_indices[19] = 0;
			raw_array_indices[20] = 4;
			raw_array_indices[21] = 0;
			raw_array_indices[22] = 1;
			raw_array_indices[23] = 0;

			n_raw_array_indices = 24;

			break;
		} /* case GL_TRIANGLES_ADJACENCY_EXT:*/

		case GL_TRIANGLE_FAN:
		{
			/* ABCDEB */
			raw_array_indices[0] = 0;
			raw_array_indices[1] = 1;
			raw_array_indices[2] = 2;
			raw_array_indices[3] = 3;
			raw_array_indices[4] = 4;
			raw_array_indices[5] = 1;

			n_raw_array_indices = 6;

			break;
		} /* case GL_TRIANGLE_FAN: */

		case GL_TRIANGLE_STRIP:
		{
			/* BACDAEB.
			 *
			 * Note that this will generate a degenerate triangle (ACD & CDA) but that's fine
			 * since we only sample triangle centroids in this test.
			 */
			raw_array_indices[0] = 1;
			raw_array_indices[1] = 0;
			raw_array_indices[2] = 2;
			raw_array_indices[3] = 3;
			raw_array_indices[4] = 0;
			raw_array_indices[5] = 4;
			raw_array_indices[6] = 1;

			n_raw_array_indices = 7;

			break;
		} /* case GL_TRIANGLE_STRIP: */

		case GL_TRIANGLE_STRIP_ADJACENCY_EXT:
		{
			/* Order as in GL_TRIANGLE_STRIP case. Adjacency data not needed for the test,
			 * hence any data can be used.
			 */
			raw_array_indices[0]  = 1;
			raw_array_indices[1]  = 0;
			raw_array_indices[2]  = 0;
			raw_array_indices[3]  = 0;
			raw_array_indices[4]  = 2;
			raw_array_indices[5]  = 0;
			raw_array_indices[6]  = 3;
			raw_array_indices[7]  = 0;
			raw_array_indices[8]  = 0;
			raw_array_indices[9]  = 0;
			raw_array_indices[10] = 4;
			raw_array_indices[11] = 0;
			raw_array_indices[12] = 1;
			raw_array_indices[13] = 0;

			n_raw_array_indices = 14;
			break;
		} /* case GL_TRIANGLE_STRIP_ADJACENCY_EXT: */

		default:
		{
			TCU_FAIL("Unsupported draw call mode");
		}
		} /* switch (m_drawcall_mode) */

		for (int index = 0; index < n_raw_array_indices; ++index)
		{
			if (raw_array_indices[index] != -1)
			{
				*raw_array_traveller_ptr = data_coordinates[raw_array_indices[index]].x();
				raw_array_traveller_ptr++;
				*raw_array_traveller_ptr = data_coordinates[raw_array_indices[index]].y();
				raw_array_traveller_ptr++;
				*raw_array_traveller_ptr = data_coordinates[raw_array_indices[index]].z();
				raw_array_traveller_ptr++;
				*raw_array_traveller_ptr = data_coordinates[raw_array_indices[index]].w();
				raw_array_traveller_ptr++;
			}
		}

		/* Generate unordered data:
		 *
		 * Store vertices in reversed order and configure indices so that the pipeline receives
		 * vertex data in original order */
		*unordered_arrays_data_size_ptr   = *raw_arrays_data_size_ptr;
		*unordered_arrays_data_ptr		  = new float[*unordered_arrays_data_size_ptr];
		*unordered_elements_data_size_ptr = static_cast<unsigned int>(n_raw_array_indices * sizeof(unsigned char));
		*unordered_elements_data_ptr	  = new unsigned char[*unordered_elements_data_size_ptr];

		/* Set unordered array data first */
		for (int index = 0; index < n_raw_array_indices; ++index)
		{
			memcpy(*unordered_arrays_data_ptr + 4 /* components */ * (n_raw_array_indices - 1 - index),
				   *raw_arrays_data_ptr + 4 /* components */ * index, sizeof(float) * 4 /* components */);
		}

		/* Followed by index data */
		for (int n = 0; n < n_raw_array_indices; ++n)
		{
			(*unordered_elements_data_ptr)[n] = (unsigned char)(n_raw_array_indices - 1 - n);
		}
	} /* for (both cases) */
}